

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

bool __thiscall AST::equalsList(AST *this,AST *t)

{
  bool bVar1;
  AST *pAVar2;
  AST *in_RSI;
  AST *in_RDI;
  AST *sibling;
  AST *in_stack_ffffffffffffff38;
  RefCount *in_stack_ffffffffffffff40;
  AST *in_stack_ffffffffffffffa0;
  AST *in_stack_ffffffffffffffa8;
  RefCount local_50 [8];
  RefCount local_48 [8];
  RefCount<AST> local_40 [3];
  RefCount local_28 [8];
  bool local_1;
  
  if (in_RSI == (AST *)0x0) {
    local_1 = false;
  }
  else {
    while (in_RDI != (AST *)0x0 && in_RSI != (AST *)0x0) {
      bVar1 = equals(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      if (!bVar1) {
        return false;
      }
      getFirstChild(in_stack_ffffffffffffff38);
      pAVar2 = RefCount::operator_cast_to_AST_(local_28);
      RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_ffffffffffffff40);
      if (pAVar2 == (AST *)0x0) {
        getFirstChild(in_stack_ffffffffffffff38);
        pAVar2 = RefCount::operator_cast_to_AST_(local_50);
        RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_ffffffffffffff40);
        if (pAVar2 != (AST *)0x0) {
          return false;
        }
      }
      else {
        getFirstChild(in_stack_ffffffffffffff38);
        RefCount<AST>::operator->(local_40);
        getFirstChild(in_stack_ffffffffffffff38);
        RefCount::operator_cast_to_AST_(local_48);
        bVar1 = equalsList(in_RSI,in_RDI);
        RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_ffffffffffffff40);
        RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_ffffffffffffff40);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
      }
      in_stack_ffffffffffffff40 = (RefCount *)&stack0xffffffffffffffa8;
      getNextSibling(in_stack_ffffffffffffff38);
      in_RDI = RefCount::operator_cast_to_AST_(in_stack_ffffffffffffff40);
      getNextSibling(in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff38 =
           RefCount::operator_cast_to_AST_((RefCount *)&stack0xffffffffffffffa0);
      in_RSI = in_stack_ffffffffffffff38;
      RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_ffffffffffffff40);
      RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_ffffffffffffff40);
    }
    if ((in_RDI == (AST *)0x0) && (in_RSI == (AST *)0x0)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool AST::equalsList(const AST* t) const
{
	// the empty tree is not a match of any non-null tree.
	if (!t)
		return false;

	// Otherwise, start walking sibling lists.  First mismatch, return false.
	const AST* sibling=this;
	for (;sibling && t;
			sibling=sibling->getNextSibling(), t=t->getNextSibling()) {
		// as a quick optimization, check roots first.
		if (!sibling->equals(t))
			return false;
		// if roots match, do full list match test on children.
		if (sibling->getFirstChild()) {
			if (!sibling->getFirstChild()->equalsList(t->getFirstChild()))
				return false;
		}
		// sibling has no kids, make sure t doesn't either
		else if (t->getFirstChild())
			return false;
	}

	if (!sibling && !t)
		return true;

	// one sibling list has more than the other
	return false;
}